

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

spv_result_t
spvBinaryParse(spv_const_context context,void *user_data,uint32_t *code,size_t num_words,
              spv_parsed_header_fn_t parsed_header,spv_parsed_instruction_fn_t parsed_instruction,
              spv_diagnostic *diagnostic)

{
  uint32_t *puVar1;
  uint32_t type_id;
  mapped_type mVar2;
  _Manager_type p_Var3;
  __node_base_ptr p_Var4;
  __node_ptr p_Var5;
  uint16_t uVar6;
  undefined4 endian;
  bool bVar7;
  spv_result_t sVar8;
  Op OVar9;
  spv_operand_type_t sVar10;
  Op OVar11;
  spv_ext_inst_type_t sVar12;
  int32_t iVar13;
  uint32_t uVar14;
  spv_result_t sVar15;
  DiagnosticStream *pDVar16;
  Op *pOVar17;
  undefined8 uVar18;
  mapped_type *pmVar19;
  __node_base_ptr p_Var20;
  _Hash_node_base *p_Var21;
  mapped_type *pmVar22;
  __node_ptr p_Var23;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var24;
  uint uVar25;
  __hash_code __c;
  __node_base _Var26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  size_type __n;
  ulong uVar30;
  ushort uVar31;
  uint uVar32;
  int iVar33;
  uint32_t *inst_offset;
  char *pcVar34;
  __node_base_ptr p_Var35;
  Op OVar36;
  long lVar37;
  Op *pOVar38;
  bool bVar39;
  byte bVar40;
  undefined1 auVar41 [16];
  spv_operand_desc entry;
  spv_opcode_desc opcode_desc;
  uint32_t first_word;
  spv_parsed_instruction_t inst;
  Parser parser;
  spv_context_t hijack_context;
  spv_header_t header;
  spv_const_binary_t binary;
  spv_operand_desc entry_2;
  uint16_t local_49a;
  uint32_t *local_498;
  ulong local_490;
  Op local_488;
  spv_parsed_operand_t local_484;
  uint local_474;
  spv_ext_inst_desc local_470;
  ulong local_468;
  undefined1 local_460 [32];
  spv_opcode_desc local_440;
  char *local_438;
  spv_operand_type_t local_42c;
  spv_parsed_instruction_t local_428;
  Op *local_3f8;
  undefined1 local_3f0 [112];
  __buckets_ptr local_380;
  ulong local_378;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_348;
  __buckets_ptr local_310;
  ulong local_308;
  spv_parsed_operand_t *local_2d8;
  iterator local_2d0;
  spv_parsed_operand_t *local_2c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c0;
  spv_operand_pattern_t local_2a8;
  long local_290;
  uint32_t *local_288;
  Op *local_280;
  spv_context_t local_278;
  spv_header_t local_238;
  spv_const_binary_t local_218;
  DiagnosticStream local_208;
  
  local_278.target_env = context->target_env;
  local_278._4_4_ = *(undefined4 *)&context->field_0x4;
  local_278.opcode_table = context->opcode_table;
  local_278.operand_table = context->operand_table;
  local_278.ext_inst_table = context->ext_inst_table;
  local_278.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_278.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_278.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_278.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var3 = (context->consumer).super__Function_base._M_manager;
  local_498 = code;
  local_460._16_8_ = num_words;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&local_278.consumer,(_Any_data *)&context->consumer,__clone_functor);
    local_278.consumer._M_invoker = (context->consumer)._M_invoker;
    local_278.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
  }
  if (diagnostic != (spv_diagnostic *)0x0) {
    *diagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&local_278,diagnostic);
  }
  local_3f0._0_4_ = local_278.target_env;
  local_3f0._8_8_ = local_278.operand_table;
  local_3f0._16_8_ = local_278.opcode_table;
  local_3f0._24_8_ = local_278.ext_inst_table;
  local_3f0._32_8_ = &local_278.consumer;
  local_3f0._40_8_ = user_data;
  local_3f0._48_8_ = parsed_header;
  local_3f0._56_8_ = parsed_instruction;
  anon_unknown.dwarf_490c93::Parser::State::State
            ((State *)(local_3f0 + 0x40),(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_490c93::Parser::State::State
            ((State *)&local_208,local_498,local_460._16_8_,diagnostic);
  anon_unknown.dwarf_490c93::Parser::State::operator=
            ((State *)(local_3f0 + 0x40),(State *)&local_208);
  anon_unknown.dwarf_490c93::Parser::State::~State((State *)&local_208);
  if ((uint32_t *)local_3f0._64_8_ == (uint32_t *)0x0) {
    anon_unknown.dwarf_490c93::Parser::diagnostic
              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
    pcVar34 = "Missing module.";
    lVar27 = 0xf;
LAB_001b8e2e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar34,lVar27);
  }
  else {
    if ((uint32_t *)0x4 < (ulong)local_3f0._72_8_) {
      local_218.code = (uint32_t *)local_3f0._64_8_;
      local_218.wordCount = local_3f0._72_8_;
      sVar8 = spvBinaryEndianness(&local_218,(spv_endianness_t *)(local_3f0 + 0x68));
      if (sVar8 == SPV_SUCCESS) {
        bVar7 = spvIsHostEndian(local_3f0._104_4_);
        local_3f0[0x6c] = !bVar7;
        sVar8 = spvBinaryHeaderGet(&local_218,local_3f0._104_4_,&local_238);
        if (sVar8 == SPV_SUCCESS) {
          if ((spv_parsed_header_fn_t)local_3f0._48_8_ == (spv_parsed_header_fn_t)0x0) {
LAB_001b8fd7:
            local_3f0._88_8_ = (uint32_t *)0x5;
LAB_001b8ffa:
            if ((ulong)local_3f0._88_8_ < (ulong)local_3f0._72_8_) {
              local_3f0._96_8_ = local_3f0._96_8_ + 1;
              local_428.type_id = 0;
              local_428.result_id = 0;
              local_428.operands = (spv_parsed_operand_t *)0x0;
              local_428.words = (uint *)0x0;
              local_428.num_words = 0;
              local_428.opcode = 0;
              local_428.ext_inst_type = SPV_EXT_INST_TYPE_NONE;
              local_428.num_operands = 0;
              local_428._34_6_ = 0;
              local_42c = anon_unknown.dwarf_490c93::Parser::peekAt
                                    ((Parser *)local_3f0,local_3f0._88_8_);
              if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              if (local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2c0,
                           (iterator)
                           local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_42c);
              }
              else {
                *local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_42c;
                local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              if (local_2d0._M_current != local_2d8) {
                local_2d0._M_current = local_2d8;
              }
              if ((ulong)local_3f0._72_8_ <= (ulong)local_3f0._88_8_) {
                __assert_fail("_.word_index < _.num_words",
                              "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                              ,0x138,
                              "spv_result_t (anonymous namespace)::Parser::parseInstruction()");
              }
              local_49a = 0;
              spvOpcodeSplit(local_42c,&local_49a,&local_428.opcode);
              if (local_49a == 0) {
                anon_unknown.dwarf_490c93::Parser::diagnostic
                          (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Invalid instruction word count: ",0x20);
LAB_001b916d:
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                OVar9 = local_208.error_;
LAB_001b917f:
                user_data = (void *)(ulong)OVar9;
                spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
              }
              else {
                sVar8 = spvtools::AssemblyGrammar::lookupOpcode
                                  ((AssemblyGrammar *)local_3f0,(uint)local_428.opcode,&local_440);
                if (sVar8 != SPV_SUCCESS) {
                  anon_unknown.dwarf_490c93::Parser::diagnostic
                            (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Invalid opcode: ",0x10);
                  goto LAB_001b916d;
                }
                local_498 = (uint32_t *)local_3f0._88_8_;
                local_3f0._88_8_ = local_3f0._88_8_ + 1;
                if (local_2a8.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_2a8.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  local_2a8.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                }
                uVar25 = (uint)local_440->numTypes;
                local_288 = (uint32_t *)local_3f0._88_8_;
                if (local_440->numTypes != 0) {
                  uVar32 = 0;
                  user_data = (spv_parsed_header_fn_t)0xffffffff;
                  do {
                    if (local_2a8.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_2a8.
                        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
                      _M_realloc_insert<spv_operand_type_t_const&>
                                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)
                                 &local_2a8,
                                 (iterator)
                                 local_2a8.
                                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 local_440->operandTypes + (int)(uVar25 + (int)user_data));
                    }
                    else {
                      *local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           local_440->operandTypes[(int)(uVar25 + (int)user_data)];
                      local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_2a8.
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar32 = uVar32 + 1;
                    uVar25 = (uint)local_440->numTypes;
                    user_data = (void *)(ulong)((int)user_data - 1);
                  } while (uVar32 < uVar25);
                }
                local_474 = (uint)parsed_header;
                inst_offset = local_498;
                do {
                  OVar9 = (Op)user_data;
                  if ((uint32_t *)((ulong)local_49a + (long)inst_offset) <= (ulong)local_3f0._88_8_)
                  {
                    if ((local_2a8.
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         local_2a8.
                         super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish) ||
                       (bVar7 = spvOperandIsOptional
                                          (local_2a8.
                                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish[-1]), bVar7))
                    {
                      if ((uint32_t *)((long)inst_offset + (ulong)local_49a) ==
                          (uint32_t *)local_3f0._88_8_) {
                        __c = (long)local_2c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2c0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                        local_460._16_4_ = OVar9;
                        if ((bool)local_3f0[0x6c] == true) {
                          __c = (long)__c >> 2;
                          if (__c != local_49a) {
                            __assert_fail("!_.requires_endian_conversion || (inst_word_count == _.endian_converted_words.size())"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                          ,0x180,
                                          "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                         );
                          }
                        }
                        else if (__c != 4) {
                          __assert_fail("_.requires_endian_conversion || (_.endian_converted_words.size() == 1)"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                        ,0x182,
                                        "spv_result_t (anonymous namespace)::Parser::parseInstruction()"
                                       );
                        }
                        uVar6 = local_428.opcode;
                        OVar9 = (Op)local_428.opcode;
                        iVar13 = spvOpcodeGeneratesType(OVar9);
                        puVar1 = local_498;
                        if (iVar13 == 0) goto LAB_001ba7c8;
                        if (OVar9 == OpTypeFloat) {
                          iVar33 = 3;
LAB_001ba593:
                          sVar10 = anon_unknown.dwarf_490c93::Parser::peekAt
                                             ((Parser *)local_3f0,(long)puVar1 + 2);
                        }
                        else {
                          iVar33 = 0;
                          sVar10 = SPV_OPERAND_TYPE_NONE;
                          if (uVar6 == 0x15) {
                            uVar14 = anon_unknown.dwarf_490c93::Parser::peekAt
                                               ((Parser *)local_3f0,(long)local_498 + 3);
                            iVar33 = 2 - (uint)(uVar14 == 0);
                            goto LAB_001ba593;
                          }
                        }
                        uVar28 = (ulong)local_428._16_8_ >> 0x20;
                        uVar29 = uVar28 % local_348._M_bucket_count;
                        p_Var23 = std::
                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  ::_M_find_node(&local_348,uVar29,&local_428.result_id,__c);
                        if (p_Var23 != (__node_ptr)0x0) goto LAB_001ba7b4;
                        p_Var23 = (__node_ptr)operator_new(0x18);
                        (p_Var23->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
                        (p_Var23->
                        super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                        ._M_storage._M_storage.__align =
                             (anon_struct_4_0_00000001_for___align)local_428.result_id;
                        *(undefined8 *)
                         ((long)&(p_Var23->
                                 super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                                 ._M_storage._M_storage + 4) = 0;
                        auVar41 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                            ((ulong)&local_348._M_rehash_policy,
                                             local_348._M_bucket_count,local_348._M_element_count);
                        __n = auVar41._8_8_;
                        if ((auVar41 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                        goto LAB_001ba731;
                        local_460._24_4_ = sVar10;
                        if (__n == 1) {
                          local_348._M_single_bucket = (__node_base_ptr)0x0;
                          __s = &local_348._M_single_bucket;
                        }
                        else {
                          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                          ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                           &local_208,__n,(void *)0x0);
                          memset(__s,0,__n * 8);
                        }
                        _Var26._M_nxt = local_348._M_before_begin._M_nxt;
                        local_348._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                        if ((__node_ptr)_Var26._M_nxt == (__node_ptr)0x0) goto LAB_001ba6ec;
                        uVar29 = 0;
                        goto LAB_001ba688;
                      }
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid word count: Op",0x16);
                      pDVar16 = spvtools::DiagnosticStream::operator<<(&local_208,&local_440->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16," says it has ",0xd);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16," words, but found ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                      lVar27 = 0xf;
                      pcVar34 = " words instead.";
                    }
                    else {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"End of input reached while decoding Op",0x26
                                );
                      pDVar16 = spvtools::DiagnosticStream::operator<<(&local_208,&local_440->name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16," starting at word ",0x12);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16,": expected more operands after ",0x1f);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                      lVar27 = 7;
                      pcVar34 = " words.";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar16,pcVar34,lVar27);
                    OVar9 = pDVar16->error_;
                    goto LAB_001b917f;
                  }
                  if (local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      local_2a8.
                      super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    anon_unknown.dwarf_490c93::Parser::diagnostic
                              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Invalid instruction Op",0x16);
                    pDVar16 = spvtools::DiagnosticStream::operator<<(&local_208,&local_440->name);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar16," starting at word ",0x12);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar16,": expected no more operands after ",0x22);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar16," words, but stated word count is ",0x21);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,".",1);
                    inst_offset = local_498;
                    OVar11 = pDVar16->error_;
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    bVar7 = false;
                    goto LAB_001b9bad;
                  }
                  sVar10 = spvTakeFirstMatchableOperand(&local_2a8);
                  uVar28 = (ulong)sVar10;
                  OVar11 = (Op)local_428.opcode;
                  local_484.offset = (short)local_3f0._88_8_ - (short)inst_offset;
                  local_484.num_words = 1;
                  local_484.number_kind = SPV_NUMBER_NONE;
                  local_484.number_bit_width = 0;
                  local_460._16_4_ = OVar9;
                  local_484.type = sVar10;
                  if ((ulong)local_3f0._72_8_ <= (ulong)local_3f0._88_8_) goto LAB_001b94a0;
                  local_488 = (Op)local_428.opcode;
                  OVar11 = anon_unknown.dwarf_490c93::Parser::peekAt
                                     ((Parser *)local_3f0,local_3f0._88_8_);
                  local_490 = CONCAT44(local_490._4_4_,OVar11);
                  local_460._24_8_ = uVar28;
                  switch(sVar10) {
                  case SPV_OPERAND_TYPE_ID:
                  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
                    if (OVar11 == OpNop) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar27 = 7;
                      pcVar34 = "Id is 0";
LAB_001b9f6a:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,pcVar34,lVar27);
                      OVar9 = local_208.error_;
                      goto LAB_001b9f7e;
                    }
                    local_484.type = SPV_OPERAND_TYPE_ID;
                    bVar7 = spvIsExtendedInstruction(local_488);
                    if ((!bVar7) || (local_484.offset != 3)) break;
                    uVar28 = (local_490 & 0xffffffff) % local_308;
                    p_Var4 = local_310[uVar28];
                    p_Var20 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var35 = p_Var4->_M_nxt, p_Var20 = p_Var4,
                       (Op)local_490 != *(Op *)&p_Var35[1]._M_nxt)) {
                      while (p_Var21 = p_Var35->_M_nxt, p_Var21 != (_Hash_node_base *)0x0) {
                        p_Var20 = (__node_base_ptr)0x0;
                        if (((ulong)*(Op *)&p_Var21[1]._M_nxt % local_308 != uVar28) ||
                           (p_Var20 = p_Var35, p_Var35 = p_Var21,
                           (Op)local_490 == *(Op *)&p_Var21[1]._M_nxt)) goto LAB_001ba2f5;
                      }
                      p_Var20 = (__node_base_ptr)0x0;
                    }
LAB_001ba2f5:
                    if (p_Var20 == (__node_base_ptr)0x0) {
                      p_Var21 = (_Hash_node_base *)0x0;
                    }
                    else {
                      p_Var21 = p_Var20->_M_nxt;
                    }
                    if (p_Var21 == (_Hash_node_base *)0x0) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"OpExtInst set Id ",0x11);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,
                                 " does not reference an OpExtInstImport result Id",0x30);
                      OVar9 = local_208.error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    }
                    else {
                      local_428.ext_inst_type =
                           *(spv_ext_inst_type_t *)((long)&p_Var21[1]._M_nxt + 4);
                      OVar9 = (Op)local_490;
                    }
                    bVar7 = p_Var21 == (_Hash_node_base *)0x0;
                    goto LAB_001ba36f;
                  case SPV_OPERAND_TYPE_TYPE_ID:
                    if (OVar11 == OpNop) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar27 = 0x13;
                      pcVar34 = "Error: Type Id is 0";
                      goto LAB_001b9f6a;
                    }
                    local_428.type_id = OVar11;
                    break;
                  case SPV_OPERAND_TYPE_RESULT_ID:
                    if (OVar11 == OpNop) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      lVar27 = 0x15;
                      pcVar34 = "Error: Result Id is 0";
                      goto LAB_001b9f6a;
                    }
                    local_428.result_id = OVar11;
                    p_Var4 = local_380[(ulong)OVar11 % local_378];
                    p_Var20 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var35 = p_Var4->_M_nxt, p_Var20 = p_Var4,
                       OVar11 != *(Op *)&p_Var35[1]._M_nxt)) {
                      while (p_Var21 = p_Var35->_M_nxt, p_Var21 != (_Hash_node_base *)0x0) {
                        p_Var20 = (__node_base_ptr)0x0;
                        if (((ulong)*(Op *)&p_Var21[1]._M_nxt % local_378 !=
                             (ulong)OVar11 % local_378) ||
                           (p_Var20 = p_Var35, p_Var35 = p_Var21,
                           OVar11 == *(Op *)&p_Var21[1]._M_nxt)) goto LAB_001ba24d;
                      }
                      p_Var20 = (__node_base_ptr)0x0;
                    }
LAB_001ba24d:
                    if ((p_Var20 != (__node_base_ptr)0x0) &&
                       (p_Var20->_M_nxt != (_Hash_node_base *)0x0)) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_ID);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Id ",3);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208," is defined more than once",0x1a);
                      OVar9 = local_208.error_;
                      goto LAB_001ba2ae;
                    }
                    iVar13 = spvOpcodeGeneratesType(local_488);
                    mVar2 = (&local_428.type_id)[iVar13 != 0];
                    pmVar22 = std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)&local_380,&local_428.result_id);
                    *pmVar22 = mVar2;
                    inst_offset = local_498;
                    break;
                  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
                  case SPV_OPERAND_TYPE_SCOPE_ID:
                    if (OVar11 == OpNop) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      local_470 = (spv_ext_inst_desc)spvOperandTypeStr(sVar10);
                      pDVar16 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_470);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16," is 0",5);
                      OVar9 = pDVar16->error_;
                      goto LAB_001b9f7e;
                    }
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
                    uVar18 = 0x100000006;
                    goto LAB_001b9d88;
                  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
                    bVar7 = spvIsExtendedInstruction(local_488);
                    if (!bVar7) {
                      __assert_fail("spvIsExtendedInstruction(opcode)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f1,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (local_428.ext_inst_type == SPV_EXT_INST_TYPE_NONE) {
                      __assert_fail("inst->ext_inst_type != SPV_EXT_INST_TYPE_NONE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                    ,0x1f2,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    sVar8 = spvtools::AssemblyGrammar::lookupExtInst
                                      ((AssemblyGrammar *)local_3f0,local_428.ext_inst_type,
                                       (Op)local_490,&local_470);
                    if (sVar8 == SPV_SUCCESS) {
                      spvPushOperandTypes(local_470->operandTypes,&local_2a8);
LAB_001ba060:
                      bVar7 = true;
                    }
                    else {
                      bVar7 = spvExtInstIsNonSemantic(local_428.ext_inst_type);
                      if (bVar7) {
                        local_208._0_4_ = 0x34;
                        if (local_2a8.
                            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish ==
                            local_2a8.
                            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
                          _M_realloc_insert<spv_operand_type_t>
                                    (&local_2a8,
                                     (iterator)
                                     local_2a8.
                                     super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                     (spv_operand_type_t *)&local_208);
                        }
                        else {
                          *local_2a8.
                           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish =
                               SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
                          local_2a8.
                          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               local_2a8.
                               super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        goto LAB_001ba060;
                      }
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid extended instruction number: ",0x25)
                      ;
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      OVar9 = local_208.error_;
                      inst_offset = local_498;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      bVar7 = false;
                    }
                    if (bVar7) break;
                    goto LAB_001b9b9f;
                  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
                    if (local_488 != OpSpecConstantOp) {
                      __assert_fail("spv::Op::OpSpecConstantOp == opcode",
                                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                    ,0x207,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    if (((int)OVar11 < 0) ||
                       (sVar8 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode
                                          ((AssemblyGrammar *)local_3f0,OVar11),
                       sVar8 != SPV_SUCCESS)) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_470 = (spv_ext_inst_desc)spvOperandTypeStr(sVar10);
                      pDVar16 = spvtools::DiagnosticStream::operator<<
                                          (&local_208,(char **)&local_470);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar16,": ",2);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                      OVar9 = pDVar16->error_;
LAB_001ba2ae:
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      inst_offset = local_498;
                      goto LAB_001b9b9f;
                    }
                    local_470 = (spv_ext_inst_desc)0x0;
                    OVar36 = spvtools::AssemblyGrammar::lookupOpcode
                                       ((AssemblyGrammar *)local_3f0,OVar11,
                                        (spv_opcode_desc *)&local_470);
                    if (OVar36 == OpNop) {
                      if (*(byte *)((long)local_470->operandTypes + 0x55) == 0) {
                        __assert_fail("opcode_entry->hasType",
                                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                      ,0x215,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((char)local_470->operandTypes[0x15] == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("opcode_entry->hasResult",
                                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                      ,0x216,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      if ((ushort)(short)local_470->operandTypes[4] < SPV_OPERAND_TYPE_TYPE_ID) {
                        __assert_fail("opcode_entry->numTypes >= 2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                      ,0x217,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      spvPushOperandTypes(local_470->operandTypes + 7,&local_2a8);
                      inst_offset = local_498;
                    }
                    else {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INTERNAL);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"OpSpecConstant opcode table out of sync",
                                 0x27);
                      OVar9 = local_208.error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      inst_offset = local_498;
                    }
                    goto joined_r0x001b9a76;
                  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
                  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
                    local_484.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
                    if ((local_488 == OpConstant) || (local_488 == OpSpecConstant)) {
                      if (local_428.type_id == SPV_OPERAND_TYPE_NONE) {
                        __assert_fail("inst->type_id",
                                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                      ,0x24d,
                                      "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                     );
                      }
                      OVar9 = anon_unknown.dwarf_490c93::Parser::setNumericTypeInfoForType
                                        ((Parser *)local_3f0,&local_484,local_428.type_id);
                      OVar36 = OVar9;
                      goto joined_r0x001b9a76;
                    }
                    if (local_488 != OpSwitch) {
                      __assert_fail("opcode == spv::Op::OpConstant || opcode == spv::Op::OpSpecConstant"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                    ,0x24a,
                                    "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                   );
                    }
                    uVar14 = anon_unknown.dwarf_490c93::Parser::peekAt
                                       ((Parser *)local_3f0,(size_t)local_288);
                    p_Var4 = local_380[(ulong)uVar14 % local_378];
                    p_Var20 = (__node_base_ptr)0x0;
                    if ((p_Var4 != (__node_base_ptr)0x0) &&
                       (p_Var35 = p_Var4->_M_nxt, p_Var20 = p_Var4,
                       uVar14 != *(uint32_t *)&p_Var35[1]._M_nxt)) {
                      while (p_Var21 = p_Var35->_M_nxt, p_Var21 != (_Hash_node_base *)0x0) {
                        p_Var20 = (__node_base_ptr)0x0;
                        if (((ulong)*(uint *)&p_Var21[1]._M_nxt % local_378 !=
                             (ulong)uVar14 % local_378) ||
                           (p_Var20 = p_Var35, p_Var35 = p_Var21,
                           uVar14 == *(uint *)&p_Var21[1]._M_nxt)) goto LAB_001ba114;
                      }
                      p_Var20 = (__node_base_ptr)0x0;
                    }
LAB_001ba114:
                    if (p_Var20 == (__node_base_ptr)0x0) {
                      p_Var21 = (_Hash_node_base *)0x0;
                    }
                    else {
                      p_Var21 = p_Var20->_M_nxt;
                    }
                    if ((p_Var21 == (_Hash_node_base *)0x0) ||
                       (type_id = *(uint32_t *)((long)&p_Var21[1]._M_nxt + 4), type_id == 0)) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                      lVar27 = 0xc;
                      pcVar34 = " has no type";
LAB_001ba1c2:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,pcVar34,lVar27);
                      OVar9 = local_208.error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001ba1d6:
                      bVar7 = false;
                    }
                    else {
                      if (uVar14 == type_id) {
                        anon_unknown.dwarf_490c93::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar27 = 0x17;
                        pcVar34 = " is a type, not a value";
                        goto LAB_001ba1c2;
                      }
                      OVar9 = anon_unknown.dwarf_490c93::Parser::setNumericTypeInfoForType
                                        ((Parser *)local_3f0,&local_484,type_id);
                      if (OVar9 != OpNop) goto LAB_001ba1d6;
                      bVar7 = true;
                      if (local_484.number_kind - SPV_NUMBER_FLOATING < 0xfffffffe) {
                        anon_unknown.dwarf_490c93::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Invalid OpSwitch: selector id ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        lVar27 = 0x18;
                        pcVar34 = " is not a scalar integer";
                        goto LAB_001ba1c2;
                      }
                    }
                    bVar7 = !bVar7;
LAB_001ba36f:
                    inst_offset = local_498;
                    if (!bVar7) break;
                    goto LAB_001b9b9f;
                  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
                    uVar18 = 0x30000000a;
LAB_001b9d88:
                    local_484.type = (spv_operand_type_t)uVar18;
                    local_484.number_kind = (spv_number_kind_t)((ulong)uVar18 >> 0x20);
                    local_484.number_bit_width = 0x20;
                    break;
                  case SPV_OPERAND_TYPE_LITERAL_STRING:
                  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
                    local_470 = (spv_ext_inst_desc)local_460;
                    local_468 = 0;
                    local_460[0] = 0;
                    local_290 = local_3f0._72_8_ - local_3f0._88_8_;
                    bVar40 = local_290 == 0;
                    if (!(bool)bVar40) {
                      local_280 = (Op *)(local_3f0._64_8_ + local_3f0._72_8_ * 4);
                      pOVar17 = (Op *)(local_3f0._64_8_ + local_3f0._88_8_ * 4);
                      bVar7 = false;
                      local_490 = 0;
                      do {
                        OVar9 = *pOVar17;
                        bVar40 = 0;
                        bVar39 = false;
                        pOVar38 = (Op *)0x0;
                        local_3f8 = pOVar17;
                        do {
                          if ((char)(OVar9 >> (bVar40 & 0x1f)) == '\0') {
                            local_490 = CONCAT71((int7)((ulong)pOVar17 >> 8),1);
                            break;
                          }
                          std::__cxx11::string::push_back((char)&local_470);
                          bVar39 = (Op *)0x2 < pOVar38;
                          pOVar17 = (Op *)((long)pOVar38 + 1);
                          bVar40 = bVar40 + 8;
                          pOVar38 = pOVar17;
                        } while (pOVar17 != (Op *)0x4);
                        if (!bVar39) break;
                        pOVar17 = local_3f8 + 1;
                        bVar7 = pOVar17 == local_280;
                      } while (!bVar7);
                      bVar40 = bVar7 | (byte)local_490;
                      parsed_header = (spv_parsed_header_fn_t)(ulong)local_474;
                      sVar10 = (spv_operand_type_t)local_460._24_8_;
                      inst_offset = local_498;
                    }
                    if (((bVar40 & 1) == 0) && (local_470 != (spv_ext_inst_desc)local_460)) {
                      operator_delete(local_470,CONCAT71(local_460._1_7_,local_460[0]) + 1);
                    }
                    if (local_468 == local_290 << 2) {
                      OVar9 = anon_unknown.dwarf_490c93::Parser::exhaustedInputDiagnostic
                                        ((Parser *)local_3f0,(size_t)inst_offset,local_488,sVar10);
                      bVar7 = false;
                    }
                    else {
                      uVar31 = (short)(local_468 >> 2) + 1;
                      if (local_468 < 0x3fffc) {
                        local_484.type = SPV_OPERAND_TYPE_LITERAL_STRING;
                        bVar7 = true;
                        inst_offset = local_498;
                        local_484.num_words = uVar31;
                        if (local_488 == OpExtInstImport) {
                          sVar12 = spvExtInstImportTypeGet((char *)local_470);
                          if (sVar12 == SPV_EXT_INST_TYPE_NONE) {
                            anon_unknown.dwarf_490c93::Parser::diagnostic
                                      (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,
                                       "Invalid extended instruction import \'",0x25);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,(char *)local_470,local_468);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,"\'",1);
                            goto LAB_001b9ee3;
                          }
                          if (local_428.result_id == SPV_OPERAND_TYPE_NONE) {
                            __assert_fail("inst->result_id",
                                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                          ,0x276,
                                          "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                         );
                          }
                          pmVar19 = std::__detail::
                                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&local_310,&local_428.result_id);
                          *pmVar19 = sVar12;
                          inst_offset = local_498;
                        }
                      }
                      else {
                        anon_unknown.dwarf_490c93::Parser::diagnostic
                                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Literal string is longer than ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," words: ",8);
                        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," words long",0xb);
LAB_001b9ee3:
                        OVar9 = local_208.error_;
                        spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                        bVar7 = false;
                        inst_offset = local_498;
                      }
                    }
                    if (local_470 != (spv_ext_inst_desc)local_460) {
                      operator_delete(local_470,CONCAT71(local_460._1_7_,local_460[0]) + 1);
                    }
                    if (!bVar7) goto LAB_001b9b9f;
                    break;
                  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
                    OVar36 = spvtools::AssemblyGrammar::lookupOperand
                                       ((AssemblyGrammar *)local_3f0,sVar10,OVar11,
                                        (spv_operand_desc *)&local_470);
                    if (OVar36 != OpNop) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_438 = spvOperandTypeStr(local_484.type);
                      pDVar16 = spvtools::DiagnosticStream::operator<<(&local_208,&local_438);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16," operand: ",10);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16,
                                 ", if you are creating a new source language please use value 0 (Unknown) and when ready, add your source language to SPIRV-Headers"
                                 ,0x82);
LAB_001b93a5:
                      inst_offset = local_498;
                      OVar9 = pDVar16->error_;
                      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                      goto joined_r0x001b9a76;
                    }
                    goto LAB_001b9a62;
                  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
                  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
                  case SPV_OPERAND_TYPE_MEMORY_MODEL:
                  case SPV_OPERAND_TYPE_EXECUTION_MODE:
                  case SPV_OPERAND_TYPE_STORAGE_CLASS:
                  case SPV_OPERAND_TYPE_DIMENSIONALITY:
                  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
                  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
                  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
                  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
                  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
                  case SPV_OPERAND_TYPE_DECORATION:
                  case SPV_OPERAND_TYPE_BUILT_IN:
                  case SPV_OPERAND_TYPE_GROUP_OPERATION:
                  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
                  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
                  case SPV_OPERAND_TYPE_CAPABILITY:
                  case SPV_OPERAND_TYPE_FPENCODING:
                  case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
                  case SPV_OPERAND_TYPE_FPDENORM_MODE:
                  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
                  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
                  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
                  case SPV_OPERAND_TYPE_RAY_FLAGS:
                  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
                  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
                  case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
                  case SPV_OPERAND_TYPE_HOST_ACCESS_QUALIFIER:
                  case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
                  case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
                    if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT) {
                      local_484.type = SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT;
LAB_001b930e:
                      if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_FPENCODING) {
                        local_484.type = SPV_OPERAND_TYPE_FPENCODING;
                      }
                    }
                    else {
                      if (sVar10 != SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER) goto LAB_001b930e;
                      local_484.type = SPV_OPERAND_TYPE_ACCESS_QUALIFIER;
                    }
                    OVar36 = spvtools::AssemblyGrammar::lookupOperand
                                       ((AssemblyGrammar *)local_3f0,sVar10,OVar11,
                                        (spv_operand_desc *)&local_470);
                    if (OVar36 != OpNop) {
                      anon_unknown.dwarf_490c93::Parser::diagnostic
                                (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid ",8);
                      local_438 = spvOperandTypeStr(local_484.type);
                      pDVar16 = spvtools::DiagnosticStream::operator<<(&local_208,&local_438);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16," operand: ",10);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                      goto LAB_001b93a5;
                    }
LAB_001b9a62:
                    spvPushOperandTypes(local_470->operandTypes + 8,&local_2a8);
                    OVar9 = OVar11;
joined_r0x001b9a76:
                    if (OVar36 == OpNop) break;
                    goto LAB_001b9b9f;
                  default:
                    anon_unknown.dwarf_490c93::Parser::diagnostic
                              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Internal error: Unhandled operand type: ",0x28
                              );
                    std::ostream::operator<<(&local_208,sVar10);
                    OVar9 = local_208.error_;
LAB_001b9f7e:
                    inst_offset = local_498;
                    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                    goto LAB_001b9b9f;
                  case SPV_OPERAND_TYPE_IMAGE:
                  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
                  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
                  case SPV_OPERAND_TYPE_LOOP_CONTROL:
                  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
                  case SPV_OPERAND_TYPE_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
                  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
                  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
                  case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
                  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
                  case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
                    if ((int)sVar10 < 0x4e) {
                      if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_IMAGE) {
                        local_484.type = SPV_OPERAND_TYPE_IMAGE;
                      }
                      else if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS) {
                        local_484.type = SPV_OPERAND_TYPE_MEMORY_ACCESS;
                      }
                    }
                    else if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) {
                      local_484.type = SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS;
                    }
                    else if (sVar10 == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS) {
                      local_484.type = SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS;
                    }
                    bVar7 = OVar11 == OpNop;
                    if (!bVar7) {
                      local_3f8 = (Op *)(ulong)OVar11;
                      OVar36 = ~Max;
                      do {
                        if ((OVar36 & OVar11) != OpNop) {
                          sVar8 = spvtools::AssemblyGrammar::lookupOperand
                                            ((AssemblyGrammar *)local_3f0,(spv_operand_type_t)uVar28
                                             ,OVar36,(spv_operand_desc *)&local_470);
                          if (sVar8 == SPV_SUCCESS) {
                            OVar11 = OVar11 ^ OVar36;
                            spvPushOperandTypes(local_470->operandTypes + 8,&local_2a8);
                          }
                          else {
                            anon_unknown.dwarf_490c93::Parser::diagnostic
                                      (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_208,"Invalid ",8);
                            local_438 = spvOperandTypeStr(local_484.type);
                            pDVar16 = spvtools::DiagnosticStream::operator<<(&local_208,&local_438);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar16," operand: ",10);
                            std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar16," has invalid mask component ",0x1c);
                            std::ostream::_M_insert<unsigned_long>((ulong)pDVar16);
                            uVar28 = local_460._24_8_;
                            user_data = (void *)(ulong)(uint)pDVar16->error_;
                            spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                          }
                          OVar9 = (Op)user_data;
                          sVar10 = (spv_operand_type_t)uVar28;
                          if (sVar8 != SPV_SUCCESS) break;
                        }
                        OVar9 = (Op)user_data;
                        sVar10 = (spv_operand_type_t)uVar28;
                        OVar36 = OVar36 >> 1;
                        bVar7 = OVar11 == OpNop;
                      } while (!bVar7);
                    }
                    inst_offset = local_498;
                    parsed_header = (spv_parsed_header_fn_t)(ulong)local_474;
                    if (!bVar7) goto LAB_001b9b9f;
                    if (((Op)local_490 == 0) &&
                       (sVar8 = spvtools::AssemblyGrammar::lookupOperand
                                          ((AssemblyGrammar *)local_3f0,sVar10,0,
                                           (spv_operand_desc *)&local_208), sVar8 == SPV_SUCCESS)) {
                      spvPushOperandTypes((spv_operand_type_t *)
                                          (CONCAT44(local_208._4_4_,local_208._0_4_) + 0x38),
                                          &local_2a8);
                    }
                  }
                  bVar7 = spvOperandIsConcrete(local_484.type);
                  if (!bVar7) {
                    __assert_fail("spvOperandIsConcrete(parsed_operand.type)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                                  ,0x307,
                                  "spv_result_t (anonymous namespace)::Parser::parseOperand(size_t, spv_parsed_instruction_t *, const spv_operand_type_t, std::vector<uint32_t> *, std::vector<spv_parsed_operand_t> *, spv_operand_pattern_t *)"
                                 );
                  }
                  if (local_2d0._M_current == local_2c8) {
                    std::vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>>::
                    _M_realloc_insert<spv_parsed_operand_t_const&>
                              ((vector<spv_parsed_operand_t,std::allocator<spv_parsed_operand_t>> *)
                               &local_2d8,local_2d0,&local_484);
                  }
                  else {
                    (local_2d0._M_current)->offset = local_484.offset;
                    (local_2d0._M_current)->num_words = local_484.num_words;
                    (local_2d0._M_current)->type = local_484.type;
                    (local_2d0._M_current)->number_kind = local_484.number_kind;
                    (local_2d0._M_current)->number_bit_width = local_484.number_bit_width;
                    local_2d0._M_current = local_2d0._M_current + 1;
                  }
                  endian = local_3f0._104_4_;
                  uVar18 = local_3f0._64_8_;
                  puVar1 = (uint32_t *)(local_3f0._88_8_ + (ulong)local_484.num_words);
                  if ((ulong)local_3f0._72_8_ < puVar1) {
                    sVar10 = (spv_operand_type_t)local_460._24_8_;
                    OVar11 = local_488;
LAB_001b94a0:
                    OVar9 = anon_unknown.dwarf_490c93::Parser::exhaustedInputDiagnostic
                                      ((Parser *)local_3f0,(size_t)inst_offset,OVar11,sVar10);
                  }
                  else {
                    if (((bool)local_3f0[0x6c] == true) && ((ulong)local_484.num_words != 0)) {
                      lVar27 = local_3f0._88_8_ * 4;
                      uVar28 = (ulong)local_484.num_words;
                      lVar37 = 0;
                      do {
                        local_208._0_4_ = spvFixWord(*(uint32_t *)(uVar18 + lVar37 + lVar27),endian)
                        ;
                        if (local_2c0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_2c0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_2c0,
                                     (iterator)
                                     local_2c0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(uint *)&local_208);
                        }
                        else {
                          *local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = local_208._0_4_;
                          local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_2c0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        lVar37 = lVar37 + 4;
                      } while (uVar28 * 4 != lVar37);
                    }
                    OVar9 = OpNop;
                    parsed_header = (spv_parsed_header_fn_t)(ulong)local_474;
                    inst_offset = local_498;
                    local_3f0._88_8_ = puVar1;
                  }
LAB_001b9b9f:
                  bVar7 = OVar9 == OpNop;
                  OVar11 = local_460._16_4_;
                  if (!bVar7) {
                    OVar11 = OVar9;
                  }
LAB_001b9bad:
                  user_data = (void *)(ulong)OVar11;
                } while (bVar7);
              }
              goto LAB_001b9184;
            }
            OVar9 = OpNop;
            if (local_3f0._88_8_ != local_3f0._72_8_) {
              __assert_fail("_.word_index == _.num_words",
                            "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                            ,0x120,"spv_result_t (anonymous namespace)::Parser::parseModule()");
            }
            goto LAB_001b8eba;
          }
          OVar9 = (*(code *)local_3f0._48_8_)
                            ((void *)local_3f0._40_8_,local_3f0._104_4_,local_238.magic,
                             local_238.version,local_238.generator,local_238.bound,local_238.schema)
          ;
          parsed_header = (spv_parsed_header_fn_t)(ulong)OVar9;
          if (OVar9 == OpNop) goto LAB_001b8fd7;
          goto LAB_001b8eba;
        }
        anon_unknown.dwarf_490c93::Parser::diagnostic
                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INTERNAL);
        pcVar34 = "Internal error: unhandled header parse failure";
        lVar27 = 0x2e;
      }
      else {
        anon_unknown.dwarf_490c93::Parser::diagnostic
                  (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Invalid SPIR-V magic number \'",0x1d);
        lVar27 = *(long *)(CONCAT44(local_208._4_4_,local_208._0_4_) + -0x18);
        *(uint *)(&local_208.field_0x18 + lVar27) =
             *(uint *)(&local_208.field_0x18 + lVar27) & 0xffffffb5 | 8;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        pcVar34 = "\'.";
        lVar27 = 2;
      }
      goto LAB_001b8e2e;
    }
    anon_unknown.dwarf_490c93::Parser::diagnostic
              (&local_208,(Parser *)local_3f0,SPV_ERROR_INVALID_BINARY);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Module has incomplete header: only ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," words instead of ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
  }
  spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
  OVar9 = local_208.error_;
LAB_001b8eba:
  anon_unknown.dwarf_490c93::Parser::State::State
            ((State *)&local_208,(uint32_t *)0x0,0,(spv_diagnostic *)0x0);
  anon_unknown.dwarf_490c93::Parser::State::operator=
            ((State *)(local_3f0 + 0x40),(State *)&local_208);
  anon_unknown.dwarf_490c93::Parser::State::~State((State *)&local_208);
  anon_unknown.dwarf_490c93::Parser::State::~State((State *)(local_3f0 + 0x40));
  if (local_278.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_278.consumer.super__Function_base._M_manager)
              ((_Any_data *)&local_278.consumer,(_Any_data *)&local_278.consumer,__destroy_functor);
  }
  return OVar9;
LAB_001ba688:
  do {
    p_Var5 = (__node_ptr)((_Hash_node_base *)&(_Var26._M_nxt)->_M_nxt)->_M_nxt;
    uVar30 = (ulong)(uint)(((_Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                             *)(_Var26._M_nxt + 1))->
                          super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                          )._M_storage._M_storage.__align % __n;
    if (__s[uVar30] == (_Hash_node_base *)0x0) {
      ((_Hash_node_base *)&(_Var26._M_nxt)->_M_nxt)->_M_nxt = local_348._M_before_begin._M_nxt;
      __s[uVar30] = &local_348._M_before_begin;
      local_348._M_before_begin._M_nxt = _Var26._M_nxt;
      if (((_Hash_node_base *)&(_Var26._M_nxt)->_M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
        pp_Var24 = __s + uVar29;
        goto LAB_001ba6de;
      }
    }
    else {
      ((_Hash_node_base *)&(_Var26._M_nxt)->_M_nxt)->_M_nxt = __s[uVar30]->_M_nxt;
      pp_Var24 = &__s[uVar30]->_M_nxt;
      uVar30 = uVar29;
LAB_001ba6de:
      *pp_Var24 = _Var26._M_nxt;
    }
    _Var26._M_nxt = (_Hash_node_base *)p_Var5;
    uVar29 = uVar30;
  } while (p_Var5 != (__node_ptr)0x0);
LAB_001ba6ec:
  if (&local_348._M_single_bucket != local_348._M_buckets) {
    operator_delete(local_348._M_buckets,local_348._M_bucket_count << 3);
  }
  uVar29 = uVar28 % __n;
  sVar10 = local_460._24_4_;
  local_348._M_buckets = __s;
  local_348._M_bucket_count = __n;
LAB_001ba731:
  if (local_348._M_buckets[uVar29] == (_Hash_node_base *)0x0) {
    (p_Var23->super__Hash_node_base)._M_nxt = local_348._M_before_begin._M_nxt;
    if ((__node_ptr)local_348._M_before_begin._M_nxt != (__node_ptr)0x0) {
      local_348._M_buckets
      [(ulong)(uint)(((_Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                       *)(local_348._M_before_begin._M_nxt + 1))->
                    super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                    )._M_storage._M_storage.__align % local_348._M_bucket_count] =
           (__node_base_ptr)p_Var23;
    }
    local_348._M_buckets[uVar29] = &local_348._M_before_begin;
    local_348._M_before_begin._M_nxt = (_Hash_node_base *)p_Var23;
  }
  else {
    (p_Var23->super__Hash_node_base)._M_nxt = local_348._M_buckets[uVar29]->_M_nxt;
    local_348._M_buckets[uVar29]->_M_nxt = (_Hash_node_base *)p_Var23;
  }
  parsed_header = (spv_parsed_header_fn_t)(ulong)local_474;
  local_348._M_element_count = local_348._M_element_count + 1;
LAB_001ba7b4:
  *(int *)((long)&(p_Var23->
                  super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                  ).
                  super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                  ._M_storage._M_storage + 4) = iVar33;
  *(spv_operand_type_t *)
   ((long)&(p_Var23->
           super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
           ._M_storage._M_storage + 8) = sVar10;
  inst_offset = local_498;
LAB_001ba7c8:
  local_428.words =
       local_2c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((bool)local_3f0[0x6c] == false) {
    local_428.words = (uint *)(local_3f0._64_8_ + inst_offset * 4);
  }
  sVar8 = local_460._16_4_;
  local_428.num_words = local_49a;
  local_428.operands = local_2d8;
  local_428.num_operands = (uint16_t)((uint)((int)local_2d0._M_current - (int)local_2d8) >> 4);
  if ((spv_parsed_instruction_fn_t)local_3f0._56_8_ != (spv_parsed_instruction_fn_t)0x0) {
    sVar15 = (*(code *)local_3f0._56_8_)((void *)local_3f0._40_8_,&local_428);
    if (sVar15 != SPV_SUCCESS) {
      sVar8 = sVar15;
    }
    user_data = (void *)(ulong)(uint)sVar8;
    if (sVar15 != SPV_SUCCESS) goto LAB_001b9184;
  }
  user_data = (spv_parsed_header_fn_t)0x0;
LAB_001b9184:
  bVar7 = (int)user_data != 0;
  parsed_header = (spv_parsed_header_fn_t)((ulong)parsed_header & 0xffffffff);
  if (bVar7) {
    parsed_header = (spv_parsed_header_fn_t)user_data;
  }
  OVar9 = (Op)parsed_header;
  if (bVar7) goto LAB_001b8eba;
  goto LAB_001b8ffa;
}

Assistant:

spv_result_t spvBinaryParse(const spv_const_context context, void* user_data,
                            const uint32_t* code, const size_t num_words,
                            spv_parsed_header_fn_t parsed_header,
                            spv_parsed_instruction_fn_t parsed_instruction,
                            spv_diagnostic* diagnostic) {
  spv_context_t hijack_context = *context;
  if (diagnostic) {
    *diagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, diagnostic);
  }
  Parser parser(&hijack_context, user_data, parsed_header, parsed_instruction);
  return parser.parse(code, num_words, diagnostic);
}